

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Vector * operator*(Vector *__return_storage_ptr__,Vector *l,double lambda)

{
  bool bVar1;
  reference pdVar2;
  double *now;
  iterator __end1;
  iterator __begin1;
  Vector *__range1;
  double lambda_local;
  Vector *l_local;
  Vector *r;
  
  std::vector<double,_std::allocator<double>_>::vector(__return_storage_ptr__,l);
  __end1 = std::vector<double,_std::allocator<double>_>::begin(__return_storage_ptr__);
  now = (double *)std::vector<double,_std::allocator<double>_>::end(__return_storage_ptr__);
  while (bVar1 = __gnu_cxx::operator==<double_*,_std::vector<double,_std::allocator<double>_>_>
                           (&__end1,(__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
                                     *)&now), ((bVar1 ^ 0xffU) & 1) != 0) {
    pdVar2 = __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
             operator*(&__end1);
    *pdVar2 = lambda * *pdVar2;
    __gnu_cxx::__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Vector operator*(const Vector& l, double lambda)
{
	Vector r = l;
	for (auto& now : r)
	{
		now *= lambda;
	}
	return r;
}